

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::BadHasher>>::
find<0ul,char_const(&)[7]>
          (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::BadHasher>> *this,
          char (*params) [7])

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  size_t sVar5;
  char *in_RDX;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  
  uVar1 = *(ulong *)(params + 8);
  if (uVar1 != 0) {
    lVar2 = *(long *)(params[6] + 6);
    uVar8 = (ulong)((int)uVar1 - 1U & 0x4d2);
    iVar4 = *(int *)(lVar2 + 4 + uVar8 * 8);
    if (iVar4 != 0) {
      lVar3 = *(long *)params;
      piVar9 = (int *)(lVar2 + uVar8 * 8);
      sVar5 = strlen(in_RDX);
      sVar5 = sVar5 + 1;
      do {
        if ((((iVar4 != 1) && (*piVar9 == 0x4d2)) &&
            (lVar10 = (ulong)(iVar4 - 2) * 0x10, *(size_t *)(lVar3 + 8 + lVar10) == sVar5)) &&
           ((lVar6 = lVar3 + lVar10, sVar5 == 0 ||
            (iVar4 = bcmp(*(void **)(lVar3 + lVar10),in_RDX,sVar5), iVar4 == 0)))) break;
        uVar7 = uVar8 + 1;
        uVar8 = uVar7 & 0xffffffff;
        if (uVar7 == uVar1) {
          uVar8 = 0;
        }
        piVar9 = (int *)(lVar2 + uVar8 * 8);
        iVar4 = piVar9[1];
        lVar6 = 0;
      } while (iVar4 != 0);
      goto LAB_001523d1;
    }
  }
  lVar6 = 0;
LAB_001523d1:
  *(long *)this = lVar6;
  return (Maybe<kj::StringPtr_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}